

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O1

bool Ptex::v2_2::PtexUtils::isConstant(void *data,int stride,int ures,int vres,int pixelSize)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  void *pvVar4;
  int iVar5;
  size_t __n;
  
  if (1 < vres) {
    pvVar4 = (void *)((long)data + (long)stride);
    iVar5 = vres + -1;
    do {
      iVar1 = bcmp(data,pvVar4,(long)(pixelSize * ures));
      if (iVar1 != 0) {
        return false;
      }
      pvVar4 = (void *)((long)pvVar4 + (long)stride);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  bVar3 = ures < 2;
  if (1 < ures) {
    __n = (size_t)pixelSize;
    iVar5 = bcmp(data,(void *)((long)data + __n),__n);
    if (iVar5 == 0) {
      pvVar4 = (void *)((long)data + __n * 2);
      iVar5 = 2;
      do {
        iVar1 = iVar5;
        if (ures == iVar1) break;
        iVar2 = bcmp(data,pvVar4,__n);
        pvVar4 = (void *)((long)pvVar4 + __n);
        iVar5 = iVar1 + 1;
      } while (iVar2 == 0);
      bVar3 = ures <= iVar1;
    }
  }
  return bVar3;
}

Assistant:

bool isConstant(const void* data, int stride, int ures, int vres,
                int pixelSize)
{
    int rowlen = pixelSize * ures;
    const char* p = (const char*) data + stride;

    // compare each row with the first
    for (int i = 1; i < vres; i++, p += stride)
        if (0 != memcmp(data, p, rowlen)) return 0;

    // make sure first row is constant
    p = (const char*) data + pixelSize;
    for (int i = 1; i < ures; i++, p += pixelSize)
        if (0 != memcmp(data, p, pixelSize)) return 0;

    return 1;
}